

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualfilesystem.cpp
# Opt level: O0

bool __thiscall sai::VirtualFileSystem::Exists(VirtualFileSystem *this,char *Path)

{
  bool bVar1;
  optional<sai::VirtualFileEntry> local_88;
  char *local_18;
  char *Path_local;
  VirtualFileSystem *this_local;
  
  local_18 = Path;
  Path_local = (char *)this;
  GetEntry(&local_88,this,Path);
  bVar1 = std::optional<sai::VirtualFileEntry>::has_value(&local_88);
  std::optional<sai::VirtualFileEntry>::~optional(&local_88);
  return bVar1;
}

Assistant:

bool VirtualFileSystem::Exists(const char* Path)
{
	return GetEntry(Path).has_value();
}